

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbr2_sender.cc
# Opt level: O0

void __thiscall quic::Bbr2Sender::OnExitQuiescence(Bbr2Sender *this,QuicTime now)

{
  bool bVar1;
  QuicTime *pQVar2;
  Bbr2ProbeRttMode *pBVar3;
  Bbr2Mode local_e1;
  Bbr2Mode local_d1;
  Bbr2Mode local_c1;
  QuicTime local_b8;
  Bbr2Sender *local_b0;
  Bbr2Sender *local_a8;
  Bbr2Sender *local_a0;
  Bbr2Sender *local_98;
  Bbr2Sender *local_90;
  Bbr2Sender *local_88;
  Bbr2Sender *local_80;
  Bbr2Sender *local_78;
  int64_t local_70;
  QuicTime local_68;
  int64_t local_60;
  QuicTime local_58;
  int64_t local_50;
  QuicTime local_48;
  int64_t local_40;
  QuicTime local_38;
  Bbr2Mode local_29;
  QuicTime QStack_28;
  Bbr2Mode next_mode;
  QuicTime local_20;
  Bbr2Sender *local_18;
  Bbr2Sender *this_local;
  QuicTime now_local;
  
  local_20.time_ = (this->last_quiescence_start_).time_;
  local_18 = this;
  this_local = (Bbr2Sender *)now.time_;
  QStack_28 = QuicTime::Zero();
  bVar1 = operator!=(local_20,QStack_28);
  if (bVar1) {
    if (this->mode_ == STARTUP) {
      local_38.time_ = (int64_t)this_local;
      pQVar2 = std::min<quic::QuicTime>((QuicTime *)&this_local,&this->last_quiescence_start_);
      local_40 = pQVar2->time_;
      local_c1 = Bbr2StartupMode::OnExitQuiescence(&this->startup_,local_38,(QuicTime)local_40);
    }
    else {
      if (this->mode_ == PROBE_BW) {
        local_48.time_ = (int64_t)this_local;
        pQVar2 = std::min<quic::QuicTime>((QuicTime *)&this_local,&this->last_quiescence_start_);
        local_50 = pQVar2->time_;
        local_d1 = Bbr2ProbeBwMode::OnExitQuiescence(&this->probe_bw_,local_48,(QuicTime)local_50);
      }
      else {
        if (this->mode_ == DRAIN) {
          local_58.time_ = (int64_t)this_local;
          pQVar2 = std::min<quic::QuicTime>((QuicTime *)&this_local,&this->last_quiescence_start_);
          local_60 = pQVar2->time_;
          local_e1 = Bbr2DrainMode::OnExitQuiescence(&this->drain_,local_58,(QuicTime)local_60);
        }
        else {
          pBVar3 = probe_rtt_or_die(this);
          local_68.time_ = (int64_t)this_local;
          pQVar2 = std::min<quic::QuicTime>((QuicTime *)&this_local,&this->last_quiescence_start_);
          local_70 = pQVar2->time_;
          local_e1 = Bbr2ProbeRttMode::OnExitQuiescence(pBVar3,local_68,(QuicTime)local_70);
        }
        local_d1 = local_e1;
      }
      local_c1 = local_d1;
    }
    local_29 = local_c1;
    if (local_c1 != this->mode_) {
      if (this->mode_ == STARTUP) {
        local_78 = this_local;
        Bbr2StartupMode::Leave(&this->startup_,(QuicTime)this_local,(Bbr2CongestionEvent *)0x0);
      }
      else if (this->mode_ == PROBE_BW) {
        local_80 = this_local;
        Bbr2ProbeBwMode::Leave(&this->probe_bw_,(QuicTime)this_local,(Bbr2CongestionEvent *)0x0);
      }
      else if (this->mode_ == DRAIN) {
        local_88 = this_local;
        Bbr2DrainMode::Leave(&this->drain_,(QuicTime)this_local,(Bbr2CongestionEvent *)0x0);
      }
      else {
        pBVar3 = probe_rtt_or_die(this);
        local_90 = this_local;
        Bbr2ProbeRttMode::Leave(pBVar3,(QuicTime)this_local,(Bbr2CongestionEvent *)0x0);
      }
      this->mode_ = local_29;
      if (this->mode_ == STARTUP) {
        local_98 = this_local;
        Bbr2StartupMode::Enter(&this->startup_,(QuicTime)this_local,(Bbr2CongestionEvent *)0x0);
      }
      else if (this->mode_ == PROBE_BW) {
        local_a0 = this_local;
        Bbr2ProbeBwMode::Enter(&this->probe_bw_,(QuicTime)this_local,(Bbr2CongestionEvent *)0x0);
      }
      else if (this->mode_ == DRAIN) {
        local_a8 = this_local;
        Bbr2DrainMode::Enter(&this->drain_,(QuicTime)this_local,(Bbr2CongestionEvent *)0x0);
      }
      else {
        pBVar3 = probe_rtt_or_die(this);
        local_b0 = this_local;
        Bbr2ProbeRttMode::Enter(pBVar3,(QuicTime)this_local,(Bbr2CongestionEvent *)0x0);
      }
    }
    local_b8 = QuicTime::Zero();
    QuicTime::operator=(&this->last_quiescence_start_,&local_b8);
  }
  return;
}

Assistant:

void Bbr2Sender::OnExitQuiescence(QuicTime now) {
  if (last_quiescence_start_ != QuicTime::Zero()) {
    Bbr2Mode next_mode = BBR2_MODE_DISPATCH(
        OnExitQuiescence(now, std::min(now, last_quiescence_start_)));
    if (next_mode != mode_) {
      BBR2_MODE_DISPATCH(Leave(now, nullptr));
      mode_ = next_mode;
      BBR2_MODE_DISPATCH(Enter(now, nullptr));
    }
    last_quiescence_start_ = QuicTime::Zero();
  }
}